

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tag_util.hpp
# Opt level: O2

size_t mserialize::detail::tag_first_size(string_view tags)

{
  detail dVar1;
  char open;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  detail *this;
  char in_R8B;
  string_view s;
  
  uVar5 = tags._len;
  for (uVar3 = 0; (uVar4 = uVar5, uVar5 != uVar3 && (uVar4 = uVar3, tags._ptr[uVar3] == '['));
      uVar3 = uVar3 + 1) {
  }
  uVar3 = uVar4;
  if (uVar5 < uVar4) {
    uVar3 = uVar5;
  }
  if (uVar4 < uVar5) {
    this = (detail *)(tags._ptr + uVar3);
    s._ptr = (char *)(uVar5 - uVar3);
    dVar1 = *this;
    if (dVar1 == (detail)0x7b) {
      sVar2 = 0x7b;
      open = '}';
    }
    else if (dVar1 == (detail)0x2f) {
      sVar2 = 0x2f;
      open = '\\';
    }
    else if (dVar1 == (detail)0x3c) {
      sVar2 = 0x3c;
      open = '>';
    }
    else {
      if (dVar1 != (detail)0x28) {
        return uVar4 + 1;
      }
      sVar2 = 0x28;
      open = ')';
    }
    s._len = sVar2;
    sVar2 = size_between_balanced(this,s,open,in_R8B);
    uVar4 = uVar4 + sVar2;
  }
  return uVar4;
}

Assistant:

inline std::size_t tag_first_size(string_view tags)
{
  std::size_t result = 0;
  for (char c : tags)
  {
    if (c != '[') { break; }
    ++result;
  }
  tags.remove_prefix(result);

  if (! tags.empty())
  {
    switch (tags.front())
    {
    case '(':
      result += size_between_balanced(tags, '(', ')');
      break;
    case '<':
      result += size_between_balanced(tags, '<', '>');
      break;
    case '{':
      result += size_between_balanced(tags, '{', '}');
      break;
    case '/':
      result += size_between_balanced(tags, '/', '\\');
      break;
    default:
      result += 1; // assume arithmetic
      break;
    }
  }

  return result;
}